

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

SmallVectorImpl<llvm::DWARFDebugLoc::Entry> * __thiscall
llvm::SmallVectorImpl<llvm::DWARFDebugLoc::Entry>::operator=
          (SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *this,
          SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *RHS)

{
  uint uVar1;
  uint uVar2;
  Entry *pEVar3;
  SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *__ptr;
  void *pvVar4;
  Entry *S;
  Entry *__result;
  ulong uVar5;
  ulong MinSize;
  
  if (this != RHS) {
    pEVar3 = (Entry *)(RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                      super_SmallVectorBase.BeginX;
    if (pEVar3 == (Entry *)(RHS + 1)) {
      uVar1 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
              super_SmallVectorBase.Size;
      MinSize = (ulong)uVar1;
      uVar2 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
              super_SmallVectorBase.Size;
      uVar5 = (ulong)uVar2;
      if (uVar2 < uVar1) {
        if ((this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
            super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
            Capacity < uVar1) {
          pEVar3 = (Entry *)(this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>)
                            .super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                            super_SmallVectorBase.BeginX;
          SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::destroy_range
                    (pEVar3,pEVar3 + uVar5);
          uVar5 = 0;
          SmallVectorBase::set_size((SmallVectorBase *)this,0);
          SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::grow
                    (&this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>,MinSize
                    );
        }
        else if (uVar5 == 0) {
          uVar5 = 0;
        }
        else {
          std::__copy_move<true,false,std::random_access_iterator_tag>::
          __copy_m<llvm::DWARFDebugLoc::Entry*,llvm::DWARFDebugLoc::Entry*>
                    (pEVar3,pEVar3 + uVar5,
                     (Entry *)(this->
                              super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                              super_SmallVectorBase.BeginX);
        }
        pvVar4 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                 super_SmallVectorBase.BeginX;
        std::__uninitialized_copy<false>::
        __uninit_copy<std::move_iterator<llvm::DWARFDebugLoc::Entry*>,llvm::DWARFDebugLoc::Entry*>
                  ((Entry *)((long)pvVar4 + uVar5 * 0x28),
                   (Entry *)((ulong)(RHS->
                                    super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>
                                    ).
                                    super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>
                                    .super_SmallVectorBase.Size * 0x28 + (long)pvVar4),
                   (Entry *)(uVar5 * 0x28 +
                            (long)(this->
                                  super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                                  super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                                  super_SmallVectorBase.BeginX));
      }
      else {
        __result = (Entry *)(this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>)
                            .super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                            super_SmallVectorBase.BeginX;
        S = __result;
        if (MinSize != 0) {
          S = std::__copy_move<true,false,std::random_access_iterator_tag>::
              __copy_m<llvm::DWARFDebugLoc::Entry*,llvm::DWARFDebugLoc::Entry*>
                        (pEVar3,pEVar3 + MinSize,__result);
          __result = (Entry *)(this->
                              super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                              super_SmallVectorBase.BeginX;
          uVar5 = (ulong)(this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                         super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                         super_SmallVectorBase.Size;
        }
        SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::destroy_range
                  (S,__result + uVar5);
      }
      SmallVectorBase::set_size((SmallVectorBase *)this,MinSize);
      clear(RHS);
    }
    else {
      pEVar3 = (Entry *)(this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                        super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                        super_SmallVectorBase.BeginX;
      SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::destroy_range
                (pEVar3,pEVar3 + (this->
                                 super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                                 super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                                 super_SmallVectorBase.Size);
      __ptr = (SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *)
              (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
              super_SmallVectorBase.BeginX;
      if (__ptr != this + 1) {
        free(__ptr);
      }
      (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.BeginX
           = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
             super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase
             .BeginX;
      uVar1 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
              super_SmallVectorBase.Capacity;
      (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size =
           (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
           super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
           Size;
      (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
      Capacity = uVar1;
      (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.BeginX
           = (Entry *)(RHS + 1);
      (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size =
           0;
      (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
      Capacity = 0;
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->Size = RHS.Size;
    this->Capacity = RHS.Capacity;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->set_size(RHSSize);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);

  RHS.clear();
  return *this;
}